

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

Result * __thiscall
httplib::ClientImpl::Get
          (Result *__return_storage_ptr__,ClientImpl *this,string *path,Headers *headers,
          Progress *progress)

{
  _Rb_tree_header *p_Var1;
  _Rep_type *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  _Rb_tree_header *p_Var3;
  _Head_base<0UL,_httplib::Response_*,_false> __buf;
  ssize_t sVar4;
  _Base_ptr p_Var5;
  _Rb_tree_color _Var6;
  _Base_ptr p_Var7;
  int __flags;
  type res;
  Error error;
  Request req;
  _Head_base<0UL,_httplib::Response_*,_false> local_290;
  Error local_284;
  ClientImpl *local_280;
  Progress *local_278;
  __uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_> local_270;
  undefined1 local_268 [32];
  _Alloc_hider local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  _Alloc_hider local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  int local_1b8;
  _Alloc_hider local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Rb_tree_node_base local_168;
  size_t local_148;
  _Rb_tree_node_base local_138;
  undefined1 local_118 [128];
  function<bool_(unsigned_long,_unsigned_long)> local_98;
  size_t local_70;
  size_t local_68;
  _Any_data _Stack_60;
  undefined1 uStack_50;
  undefined7 uStack_4f;
  undefined1 uStack_48;
  undefined8 uStack_47;
  size_t local_38;
  
  local_268._0_8_ = local_268 + 0x10;
  local_268._8_8_ = 0;
  local_268[0x10] = '\0';
  local_248._M_p = (pointer)&local_238;
  local_240 = 0;
  local_238._M_local_buf[0] = '\0';
  p_Var1 = &local_228._M_impl.super__Rb_tree_header;
  local_228._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_228._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_228._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1f8._M_p = (pointer)&local_1e8;
  local_1f0 = 0;
  local_1e8._M_local_buf[0] = '\0';
  local_1d8._M_p = (pointer)&local_1c8;
  local_1d0 = 0;
  local_1c8._M_local_buf[0] = '\0';
  local_1b8 = -1;
  local_1b0._M_p = (pointer)&local_1a0;
  local_1a8 = 0;
  local_1a0._M_local_buf[0] = '\0';
  local_190._M_p = (pointer)&local_180;
  local_188 = 0;
  local_180._M_local_buf[0] = '\0';
  local_168._M_left = &local_168;
  local_168._M_color = _S_red;
  local_168._M_parent = (_Base_ptr)0x0;
  local_148 = 0;
  local_138._M_left = &local_138;
  local_138._M_color = _S_red;
  local_138._M_parent = (_Base_ptr)0x0;
  local_280 = this;
  local_278 = progress;
  local_228._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_228._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_168._M_right = local_168._M_left;
  local_138._M_right = local_138._M_left;
  memset(local_118,0,0xa8);
  local_70 = 0x14;
  local_38 = 0;
  local_68 = 0;
  _Stack_60._M_unused._M_object = (void *)0x0;
  _Stack_60._8_8_ = 0;
  uStack_50 = 0;
  uStack_4f = 0;
  uStack_48 = 0;
  uStack_47 = 0;
  __flags = 3;
  std::__cxx11::string::_M_replace((ulong)local_268,0,(char *)0x0,0x174a74);
  std::__cxx11::string::_M_assign((string *)&local_248);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&local_228,&headers->_M_t);
  std::function<bool_(unsigned_long,_unsigned_long)>::operator=(&local_98,local_278);
  __buf._M_head_impl = (Response *)operator_new(0x108);
  __s = &((__buf._M_head_impl)->version).field_2;
  memset(__s,0,0xf8);
  ((__buf._M_head_impl)->version)._M_dataplus = (_Alloc_hider)__s;
  ((__buf._M_head_impl)->version)._M_string_length = 0;
  (__buf._M_head_impl)->status = -1;
  ((__buf._M_head_impl)->reason)._M_dataplus._M_p = (pointer)&((__buf._M_head_impl)->reason).field_2
  ;
  p_Var3 = (_Rb_tree_header *)((long)&((__buf._M_head_impl)->headers)._M_t + 8);
  *(_Rb_tree_header **)((long)&((__buf._M_head_impl)->headers)._M_t + 0x18) = p_Var3;
  *(_Rb_tree_header **)((long)&((__buf._M_head_impl)->headers)._M_t + 0x20) = p_Var3;
  ((__buf._M_head_impl)->body)._M_dataplus._M_p = (pointer)&((__buf._M_head_impl)->body).field_2;
  ((__buf._M_head_impl)->location)._M_dataplus._M_p =
       (pointer)&((__buf._M_head_impl)->location).field_2;
  (__buf._M_head_impl)->content_length_ = 0;
  *(undefined8 *)&((__buf._M_head_impl)->content_provider_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&((__buf._M_head_impl)->content_provider_).super__Function_base + 8) = 0;
  *(_Manager_type *)((long)&((__buf._M_head_impl)->content_provider_).super__Function_base + 0x10) =
       (_Manager_type)0x0;
  ((__buf._M_head_impl)->content_provider_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)
   &((__buf._M_head_impl)->content_provider_resource_releaser_).super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&((__buf._M_head_impl)->content_provider_resource_releaser_).super__Function_base + 8) = 0
  ;
  *(_Manager_type *)
   ((long)&((__buf._M_head_impl)->content_provider_resource_releaser_).super__Function_base + 0x10)
       = (_Manager_type)0x0;
  *(undefined8 *)
   ((long)&((__buf._M_head_impl)->content_provider_resource_releaser_).super__Function_base + 0x12)
       = 0;
  *(undefined8 *)((long)&((__buf._M_head_impl)->content_provider_resource_releaser_)._M_invoker + 2)
       = 0;
  local_284 = Success;
  local_290._M_head_impl = __buf._M_head_impl;
  sVar4 = send(local_280,(int)local_268,__buf._M_head_impl,(size_t)&local_284,__flags);
  if ((char)sVar4 == '\0') {
    __buf._M_head_impl = (Response *)0x0;
  }
  else {
    local_290._M_head_impl = (Response *)0x0;
  }
  (__return_storage_ptr__->res_)._M_t.
  super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
  super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl = __buf._M_head_impl;
  local_270._M_t.
  super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       (tuple<httplib::Response_*,_std::default_delete<httplib::Response>_>)
       (_Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>)0x0;
  __return_storage_ptr__->err_ = local_284;
  p_Var5 = &(__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_228._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)0x0;
    p_Var2 = &(__return_storage_ptr__->request_headers_)._M_t;
    _Var6 = _S_red;
    p_Var7 = p_Var5;
  }
  else {
    p_Var2 = &local_228;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_228._M_impl.super__Rb_tree_header._M_header._M_parent;
    (local_228._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var5;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_228._M_impl.super__Rb_tree_header._M_node_count;
    local_228._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    p_Var5 = local_228._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var7 = local_228._M_impl.super__Rb_tree_header._M_header._M_right;
    _Var6 = local_228._M_impl.super__Rb_tree_header._M_header._M_color;
    local_228._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_228._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       p_Var5;
  (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       p_Var7;
  (p_Var2->_M_impl).super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _Var6;
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            ((unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)&local_270);
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            ((unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)&local_290);
  Request::~Request((Request *)local_268);
  return __return_storage_ptr__;
}

Assistant:

inline Result ClientImpl::Get(const std::string& path, const Headers& headers,
        Progress progress) {
        Request req;
        req.method = "GET";
        req.path = path;
        req.headers = headers;
        req.progress = std::move(progress);

        return send_(std::move(req));
    }